

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalExclusiveMode(Wal *pWal,int op)

{
  int iVar1;
  bool bVar2;
  
  if (op == 0) {
    if (pWal->exclusiveMode != '\0') {
      pWal->exclusiveMode = '\0';
      iVar1 = walLockShared(pWal,pWal->readLock + 3);
      if (iVar1 == 0) goto LAB_00128e99;
      pWal->exclusiveMode = '\x01';
    }
    bVar2 = false;
  }
  else {
    if (0 < op) {
      walUnlockShared(pWal,pWal->readLock + 3);
      pWal->exclusiveMode = '\x01';
      bVar2 = true;
      goto LAB_00128ea0;
    }
LAB_00128e99:
    bVar2 = pWal->exclusiveMode == '\0';
  }
LAB_00128ea0:
  return (int)bVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalExclusiveMode(Wal *pWal, int op){
  int rc;
  assert( pWal->writeLock==0 );
  assert( pWal->exclusiveMode!=WAL_HEAPMEMORY_MODE || op==-1 );

  /* pWal->readLock is usually set, but might be -1 if there was a 
  ** prior error while attempting to acquire are read-lock. This cannot 
  ** happen if the connection is actually in exclusive mode (as no xShmLock
  ** locks are taken in this case). Nor should the pager attempt to
  ** upgrade to exclusive-mode following such an error.
  */
  assert( pWal->readLock>=0 || pWal->lockError );
  assert( pWal->readLock>=0 || (op<=0 && pWal->exclusiveMode==0) );

  if( op==0 ){
    if( pWal->exclusiveMode ){
      pWal->exclusiveMode = 0;
      if( walLockShared(pWal, WAL_READ_LOCK(pWal->readLock))!=SQLITE_OK ){
        pWal->exclusiveMode = 1;
      }
      rc = pWal->exclusiveMode==0;
    }else{
      /* Already in locking_mode=NORMAL */
      rc = 0;
    }
  }else if( op>0 ){
    assert( pWal->exclusiveMode==0 );
    assert( pWal->readLock>=0 );
    walUnlockShared(pWal, WAL_READ_LOCK(pWal->readLock));
    pWal->exclusiveMode = 1;
    rc = 1;
  }else{
    rc = pWal->exclusiveMode==0;
  }
  return rc;
}